

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<BoolView>::vec<BoolView>(vec<BoolView> *this,vec<BoolView> *other)

{
  uint uVar1;
  BoolView *pBVar2;
  BoolView *pBVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = other->sz;
  this->sz = uVar1;
  this->cap = uVar1;
  pBVar3 = (BoolView *)malloc((ulong)uVar1 << 4);
  this->data = pBVar3;
  if (this->sz != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pBVar3 = this->data;
      pBVar2 = other->data;
      *(undefined ***)((long)pBVar3 + lVar4 + -8) = &PTR_finished_0020fb28;
      *(undefined1 *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar4 + 4) =
           *(undefined1 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar4 + 4);
      *(undefined4 *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar4) =
           *(undefined4 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar4);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < this->sz);
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}